

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyConcaveCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall
btSoftBodyTriangleCallback::setTimeStepAndCounters
          (btSoftBodyTriangleCallback *this,btScalar collisionMarginTriangle,
          btCollisionObjectWrapper *triBodyWrap,btDispatcherInfo *dispatchInfo,
          btManifoldResult *resultOut)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  btCollisionObjectWrapper *in_RSI;
  btVector3 *in_RDI;
  float in_XMM0_Da;
  btTransform convexInTriangleSpace;
  btTransform softTransform;
  btVector3 softBodyCenter;
  btVector3 halfExtents;
  btVector3 aabbWorldSpaceMax;
  btVector3 aabbWorldSpaceMin;
  btTransform *other;
  btTransform *this_00;
  btTransform *in_stack_fffffffffffffe70;
  btTransform *in_stack_fffffffffffffeb0;
  btTransform *in_stack_fffffffffffffeb8;
  btTransform *in_stack_fffffffffffffec8;
  btVector3 *in_stack_ffffffffffffff20;
  btVector3 *in_stack_ffffffffffffff28;
  btTransform *in_stack_ffffffffffffff30;
  btScalar in_stack_ffffffffffffff3c;
  btVector3 *in_stack_ffffffffffffff40;
  btVector3 local_7c;
  undefined4 local_6c;
  btScalar local_68 [4];
  btScalar local_58 [4];
  undefined1 local_48 [48];
  btCollisionObjectWrapper *local_18;
  
  *(undefined8 *)(in_RDI[4].m_floats + 2) = in_RDX;
  in_RDI[5].m_floats[0] = in_XMM0_Da + 0.06;
  *(undefined8 *)(in_RDI[3].m_floats + 2) = in_RCX;
  this_00 = (btTransform *)(local_48 + 0x10);
  local_18 = in_RSI;
  btVector3::btVector3((btVector3 *)this_00);
  other = (btTransform *)local_48;
  btVector3::btVector3((btVector3 *)other);
  (**(code **)(**(long **)(in_RDI->m_floats + 2) + 0x38))
            (*(long **)(in_RDI->m_floats + 2),this_00,other);
  local_68 = (btScalar  [4])operator-((btVector3 *)in_stack_fffffffffffffe70,in_RDI);
  local_6c = 0x3f000000;
  local_58 = (btScalar  [4])::operator*((btVector3 *)in_stack_fffffffffffffe70,in_RDI->m_floats);
  operator+((btVector3 *)in_stack_fffffffffffffe70,in_RDI);
  local_7c = ::operator*((btVector3 *)in_stack_fffffffffffffe70,in_RDI->m_floats);
  btTransform::btTransform(this_00);
  btTransform::setIdentity(in_stack_fffffffffffffe70);
  btTransform::setOrigin((btTransform *)&stack0xffffffffffffff30,&local_7c);
  btTransform::btTransform(this_00);
  btCollisionObjectWrapper::getWorldTransform(local_18);
  btTransform::inverse(in_stack_fffffffffffffec8);
  btTransform::operator*(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  btTransform::operator=(this_00,other);
  btTransformAabb(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30,
                  in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  return;
}

Assistant:

void	btSoftBodyTriangleCallback::setTimeStepAndCounters(btScalar collisionMarginTriangle,const btCollisionObjectWrapper* triBodyWrap, const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	m_dispatchInfoPtr = &dispatchInfo;
	m_collisionMarginTriangle = collisionMarginTriangle+btScalar(BT_SOFTBODY_TRIANGLE_EXTRUSION);
	m_resultOut = resultOut;


	btVector3	aabbWorldSpaceMin,aabbWorldSpaceMax;
	m_softBody->getAabb(aabbWorldSpaceMin,aabbWorldSpaceMax);
	btVector3 halfExtents = (aabbWorldSpaceMax-aabbWorldSpaceMin)*btScalar(0.5);
	btVector3 softBodyCenter = (aabbWorldSpaceMax+aabbWorldSpaceMin)*btScalar(0.5);

	btTransform softTransform;
	softTransform.setIdentity();
	softTransform.setOrigin(softBodyCenter);

	btTransform convexInTriangleSpace;
	convexInTriangleSpace = triBodyWrap->getWorldTransform().inverse() * softTransform;
	btTransformAabb(halfExtents,m_collisionMarginTriangle,convexInTriangleSpace,m_aabbMin,m_aabbMax);
}